

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Gia_Man_t * Gia_ManFraigReduceGia(Gia_Man_t *p,int *pReprs)

{
  ulong uVar1;
  int iVar2;
  int iLit1;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pObj;
  int v;
  
  if (pReprs == (int *)0x0) {
    __assert_fail("pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x15f,"Gia_Man_t *Gia_ManFraigReduceGia(Gia_Man_t *, int *)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x160,"Gia_Man_t *Gia_ManFraigReduceGia(Gia_Man_t *, int *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManFillValue(p);
  Gia_ManHashAlloc(p_00);
  for (v = 0; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pObj;
    uVar3 = (uint)uVar1;
    if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar3 < 0) {
      if ((~uVar3 & 0x9fffffff) == 0) {
        uVar3 = Gia_ManAppendCi(p_00);
      }
      else if ((int)uVar3 < 0 && (int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
        iVar2 = Gia_ObjFanin0CopyRepr(p,pObj,pReprs);
        uVar3 = Gia_ManAppendCo(p_00,iVar2);
      }
      else {
        uVar3 = 0;
        if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                        ,0x170,"Gia_Man_t *Gia_ManFraigReduceGia(Gia_Man_t *, int *)");
        }
      }
    }
    else {
      iVar2 = Gia_ObjFanin0CopyRepr(p,pObj,pReprs);
      iLit1 = Gia_ObjFanin1CopyRepr(p,pObj,pReprs);
      uVar3 = Gia_ManHashAnd(p_00,iVar2,iLit1);
    }
    pObj->Value = uVar3;
  }
  Gia_ManHashStop(p_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFraigReduceGia( Gia_Man_t * p, int * pReprs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( pReprs != NULL );
    assert( Gia_ManRegNum(p) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0CopyRepr(p, pObj, pReprs), Gia_ObjFanin1CopyRepr(p, pObj, pReprs) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0CopyRepr(p, pObj, pReprs) );
        else if ( Gia_ObjIsConst0(pObj) )
            pObj->Value = 0;
        else assert( 0 );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}